

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::DynArrayDeleteMethod::eval
          (ConstantValue *__return_storage_ptr__,DynArrayDeleteMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  bool bVar1;
  reference ppEVar2;
  Type *this_00;
  ConstantValue local_1f8;
  undefined4 local_1d0;
  undefined1 local_1c0 [8];
  LValue lval;
  Args *args_local;
  EvalContext *context_local;
  DynArrayDeleteMethod *this_local;
  SourceRange param_3_local;
  
  lval.value.
  super__Variant_base<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
  .
  super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  ._384_8_ = args;
  ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            operator[](args,0);
  Expression::evalLValue((LValue *)local_1c0,*ppEVar2,context);
  bVar1 = LValue::operator_cast_to_bool((LValue *)local_1c0);
  if (bVar1) {
    ppEVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         lval.value.
                         super__Variant_base<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                         .
                         super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                         .
                         super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                         .
                         super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                         .
                         super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                         .
                         super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                         ._384_8_,0);
    this_00 = not_null<const_slang::ast::Type_*>::operator->(&(*ppEVar2)->type);
    Type::getDefaultValue(&local_1f8,this_00);
    LValue::store((LValue *)local_1c0,&local_1f8);
    slang::ConstantValue::~ConstantValue(&local_1f8);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
  }
  local_1d0 = 1;
  LValue::~LValue((LValue *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        lval.store(args[0]->type->getDefaultValue());
        return nullptr;
    }